

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BreakpointProbeList * __thiscall Js::DebugDocument::GetBreakpointList(DebugDocument *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ScriptContext *this_00;
  ArenaAllocator *arena;
  undefined4 *puVar4;
  BreakpointProbeList *pBVar5;
  ArenaAllocator *diagnosticArena;
  ScriptContext *scriptContext;
  DebugDocument *this_local;
  
  if (this->m_breakpointList == (BreakpointProbeList *)0x0) {
    this_00 = Utf8SourceInfo::GetScriptContext(this->utf8SourceInfo);
    if ((this_00 != (ScriptContext *)0x0) &&
       (uVar3 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(),
       (uVar3 & 1) == 0)) {
      arena = ScriptContext::AllocatorForDiagnostics(this_00);
      if (arena == (ArenaAllocator *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                    ,0x3a,"(diagnosticArena)","diagnosticArena");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pBVar5 = NewBreakpointList(this,arena);
      this->m_breakpointList = pBVar5;
      return this->m_breakpointList;
    }
    this_local = (DebugDocument *)0x0;
  }
  else {
    this_local = (DebugDocument *)this->m_breakpointList;
  }
  return (BreakpointProbeList *)this_local;
}

Assistant:

BreakpointProbeList* DebugDocument::GetBreakpointList()
    {
        if (m_breakpointList != nullptr)
        {
            return m_breakpointList;
        }

        ScriptContext * scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        ArenaAllocator* diagnosticArena = scriptContext->AllocatorForDiagnostics();
        Assert(diagnosticArena);

        m_breakpointList = this->NewBreakpointList(diagnosticArena);
        return m_breakpointList;
    }